

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

size_t Base32ToByteStream(char *inBuf,size_t len,uint8_t *outBuf,size_t outLen)

{
  char cVar1;
  ulong uVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  byte bVar6;
  
  if (len == 0) {
    return 0;
  }
  sVar4 = 0;
  uVar2 = 0;
  iVar3 = 0;
  uVar5 = 0;
  do {
    cVar1 = inBuf[sVar4];
    if ((byte)(cVar1 - 0x32U) < 6) {
      bVar6 = cVar1 - 0x18;
    }
    else {
      bVar6 = cVar1 + 0x9f;
      if (0x19 < bVar6) {
        return 0;
      }
    }
    if (iVar3 < 3) {
      iVar3 = iVar3 + 5;
    }
    else {
      if (outLen <= uVar2) {
        return uVar2;
      }
      iVar3 = iVar3 + -3;
      outBuf[uVar2] = (uint8_t)((int)(uVar5 | bVar6) >> ((byte)iVar3 & 0x1f));
      uVar2 = uVar2 + 1;
    }
    uVar5 = (uVar5 | bVar6) << 5;
    sVar4 = sVar4 + 1;
  } while (len != sVar4);
  return uVar2;
}

Assistant:

size_t Base32ToByteStream (const char * inBuf, size_t len, uint8_t * outBuf, size_t outLen)
	{
		int tmp = 0, bits = 0;
		size_t ret = 0;
		for (size_t i = 0; i < len; i++)
		{
			char ch = inBuf[i];
			if (ch >= '2' && ch <= '7') // digit
				ch = (ch - '2') + 26; // 26 means a-z
			else if (ch >= 'a' && ch <= 'z')
				ch = ch - 'a'; // a = 0
			else
				return 0; // unexpected character

			tmp |= ch;
			bits += 5;
			if (bits >= 8)
			{
				if (ret >= outLen) return ret;
				outBuf[ret] = tmp >> (bits - 8);
				bits -= 8;
				ret++;
			}
			tmp <<= 5;
		}
		return ret;
	}